

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O2

Vector<float,_4UL> __thiscall
Gs::operator*(Gs *this,Vector<float,_3UL> *lhs,Matrix<float,_3UL,_4UL> *rhs)

{
  size_t c;
  long lVar1;
  Vector<float,_4UL> *result;
  long lVar2;
  float fVar3;
  float fVar4;
  ulong in_XMM1_Qa;
  Vector<float,_4UL> VVar5;
  
  fVar3 = 0.0;
  *(undefined4 *)this = 0;
  *(undefined4 *)(this + 4) = 0;
  *(undefined4 *)(this + 8) = 0;
  *(undefined4 *)(this + 0xc) = 0x3f800000;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar3 = 0.0;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      fVar4 = *(float *)((long)rhs + lVar2 * 4) * (&lhs->x)[lVar2];
      in_XMM1_Qa = (ulong)(uint)fVar4;
      fVar3 = fVar3 + fVar4;
    }
    *(float *)(this + lVar1 * 4) = fVar3;
    rhs = (Matrix<float,_3UL,_4UL> *)((long)rhs + 0xc);
  }
  VVar5.y = 0.0;
  VVar5.x = fVar3;
  VVar5.z = (float)(int)in_XMM1_Qa;
  VVar5.w = (float)(int)(in_XMM1_Qa >> 0x20);
  return VVar5;
}

Assistant:

Vector<T, Cols> operator * (const Vector<T, Rows>& lhs, const Matrix<T, Rows, Cols>& rhs)
{
    Vector<T, Cols> result;

    for (std::size_t c = 0; c < Cols; ++c)
    {
        result[c] = T(0);
        for (std::size_t r = 0; r < Rows; ++r)
            result[c] += rhs(r, c)*lhs[r];
    }

    return result;
}